

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O3

int run_test_tcp_close_reset_accepted_after_socket_shutdown(void)

{
  uv_loop_t *loop;
  int iVar1;
  int iVar2;
  undefined8 *extraout_RDX;
  uv_tcp_t *in_RSI;
  uv_stream_t *server;
  int64_t eval_b;
  int64_t eval_a;
  void *local_18;
  void *local_10;
  
  iVar2 = (int)&local_18;
  ::loop = uv_default_loop();
  start_server(::loop,in_RSI);
  client_close = 0;
  shutdown_before_close = 2;
  do_connect(::loop,in_RSI);
  local_10 = (void *)(long)write_cb_called;
  local_18 = (void *)0x0;
  if (local_10 == (void *)0x0) {
    local_10 = (void *)(long)close_cb_called;
    local_18 = (void *)0x0;
    if (local_10 != (void *)0x0) goto LAB_001c6147;
    local_10 = (void *)(long)shutdown_cb_called;
    local_18 = (void *)0x0;
    if (local_10 != (void *)0x0) goto LAB_001c6154;
    iVar1 = uv_run(::loop,UV_RUN_DEFAULT);
    loop = ::loop;
    local_10 = (void *)(long)iVar1;
    local_18 = (void *)0x0;
    if (local_10 != (void *)0x0) goto LAB_001c6161;
    local_10 = (void *)0x4;
    local_18 = (void *)(long)write_cb_called;
    if (local_18 != (void *)0x4) goto LAB_001c616e;
    local_10 = (void *)0x1;
    local_18 = (void *)(long)close_cb_called;
    if (local_18 != (void *)0x1) goto LAB_001c617b;
    local_10 = (void *)(long)shutdown_cb_called;
    local_18 = (void *)0x0;
    if (local_10 != (void *)0x0) goto LAB_001c6188;
    uv_walk(::loop,close_walk_cb,(void *)0x0);
    uv_run(loop,UV_RUN_DEFAULT);
    local_10 = (void *)0x0;
    iVar1 = uv_loop_close(::loop);
    local_18 = (void *)(long)iVar1;
    if (local_10 == local_18) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_1();
LAB_001c6147:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_2();
LAB_001c6154:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_3();
LAB_001c6161:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_4();
LAB_001c616e:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_5();
LAB_001c617b:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_6();
LAB_001c6188:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_7();
  }
  server = (uv_stream_t *)&stack0xfffffffffffffff0;
  run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_8();
  if (iVar2 == 0) {
    iVar2 = uv_tcp_init(::loop,&tcp_accepted);
    if (iVar2 == 0) {
      iVar2 = uv_accept(server,(uv_stream_t *)&tcp_accepted);
      if (iVar2 == 0) {
        iVar2 = uv_read_start((uv_stream_t *)&tcp_accepted,alloc_cb,read_cb);
        return iVar2;
      }
      goto LAB_001c6254;
    }
  }
  else {
    connection_cb_cold_1();
  }
  connection_cb_cold_2();
LAB_001c6254:
  connection_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x400;
  return 0x399040;
}

Assistant:

TEST_IMPL(tcp_close_reset_accepted_after_socket_shutdown) {
  int r;

  loop = uv_default_loop();

  start_server(loop, &tcp_server);

  client_close = 0;
  shutdown_before_close = 2;

  do_connect(loop, &tcp_client);

  ASSERT_OK(write_cb_called);
  ASSERT_OK(close_cb_called);
  ASSERT_OK(shutdown_cb_called);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(4, write_cb_called);
  ASSERT_EQ(1, close_cb_called);
  ASSERT_OK(shutdown_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}